

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::expRightToLeft(BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod)

{
  pointer puVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  pointer puVar5;
  ulong uVar6;
  BN S;
  BN local_88;
  ulong local_70;
  ulong local_68;
  BN local_60;
  BN local_48;
  
  puVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1) < 3) && (*puVar1 == 0)) {
    bn1();
  }
  else {
    bn1();
    operator%(&local_60,this,mod);
    puVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar2 = puVar1[-1];
    if (uVar2 == 0) {
      lVar3 = -0x10;
    }
    else {
      uVar4 = 0xf;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      lVar3 = (ulong)(ushort)((uVar4 ^ 0xfff0) + 0x11) - 0x10;
    }
    puVar5 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_68 = ((long)puVar1 - (long)puVar5) * 8 + lVar3;
    if (local_68 != 0) {
      local_70 = ~((long)puVar5 * 8) + lVar3 + (long)puVar1 * 8;
      uVar2 = 1;
      uVar6 = 0;
      do {
        uVar4 = 1;
        if (1 < uVar2) {
          uVar4 = uVar2;
        }
        if ((puVar5[uVar2 == 0] & uVar4) != 0) {
          karatsubaMultiplication(&local_88,__return_storage_ptr__,&local_60);
          operator%(&local_48,&local_88,mod);
          if (&local_48 != __return_storage_ptr__) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                      (&__return_storage_ptr__->ba,&local_48.ba);
          }
          if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_70 != uVar6) {
          Qrt(&local_88,&local_60);
          operator%(&local_48,&local_88,mod);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                    (&local_60.ba,&local_48.ba);
          if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        puVar5 = puVar5 + (uVar2 == 0);
        uVar6 = uVar6 + 1;
        uVar2 = uVar4 * 2;
      } while (uVar6 < local_68);
    }
    if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expRightToLeft(const BN& exponent, const BN& mod) const {
    if(exponent.is0())
        return BN::bn1();

    BN result(BN::bn1());
    BN S = *this % mod;

    size_t len = exponent.bitCount();
    bt mask = 1;
    const bt *curr = &*exponent.ba.begin();
    for(size_t i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if(*curr & mask)
            result = move(result * S % mod);

        if (i + 1 != len)
            S = move(S.Qrt() % mod);
        mask <<= 1;
    }
    return result;
}